

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enum.hpp
# Opt level: O0

void Reflection::Enum::declare<Analyser::Static::AtariST::Target::MemorySize>
               (char *name,char *declaration)

{
  pointer pbVar1;
  int iVar2;
  ulong uVar3;
  pair<std::type_index,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__args;
  pair<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__args_00;
  bool bVar4;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  type_index local_e0;
  pair<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  pair<std::__detail::_Node_iterator<std::pair<const_std::type_index,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>,_bool>
  *local_b0;
  type_index local_a0;
  pair<std::type_index,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pointer local_40;
  char *start;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  char *d_ptr;
  char *declaration_local;
  char *name_local;
  
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)declaration;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&start);
  while( true ) {
    while( true ) {
      bVar4 = false;
      if ((result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus != (_Alloc_hider)0x0) {
        iVar2 = isalpha((int)(char)(result.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus
                       );
        bVar4 = iVar2 == 0;
      }
      if (!bVar4) break;
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)&(result.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1;
    }
    if ((result.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus == (_Alloc_hider)0x0)
    break;
    local_40 = result.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    while( true ) {
      iVar2 = isalpha((int)(char)(result.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus);
      bVar4 = true;
      if (iVar2 == 0) {
        iVar2 = isdigit((int)(char)(result.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus
                       );
        bVar4 = iVar2 != 0;
      }
      pbVar1 = local_40;
      if (!bVar4) break;
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)&(result.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1;
    }
    uVar3 = (long)result.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_40;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,(char *)pbVar1,uVar3,&local_61);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&start,&local_60
              );
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  std::type_index::type_index
            (&local_a0,(type_info *)&Analyser::Static::AtariST::Target::MemorySize::typeinfo);
  std::
  make_pair<std::type_index,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            (&local_98,&local_a0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&start);
  local_b0 = std::
             unordered_map<std::type_index,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::hash<std::type_index>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
             ::
             emplace<std::pair<std::type_index,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       ((pair<std::__detail::_Node_iterator<std::pair<const_std::type_index,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>,_bool>
                         *)&members_by_type__abi_cxx11_,&local_98,__args);
  std::
  pair<std::type_index,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~pair(&local_98);
  std::type_index::type_index
            (&local_e0,(type_info *)&Analyser::Static::AtariST::Target::MemorySize::typeinfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,name,&local_101);
  std::make_pair<std::type_index,std::__cxx11::string>(&local_d8,&local_e0,&local_100);
  std::
  unordered_map<std::type_index,std::__cxx11::string,std::hash<std::type_index>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::__cxx11::string>>>
  ::emplace<std::pair<std::type_index,std::__cxx11::string>>
            ((pair<std::__detail::_Node_iterator<std::pair<const_std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
              *)&names_by_type__abi_cxx11_,&local_d8,__args_00);
  std::
  pair<std::type_index,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_d8);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&start);
  return;
}

Assistant:

static void declare(const char *name, const char *declaration) {
			const char *d_ptr = declaration;

			std::vector<std::string> result;
			while(true) {
				// Skip non-alphas, and exit if the terminator is found.
				while(*d_ptr && !isalpha(*d_ptr)) ++d_ptr;
				if(!*d_ptr) break;

				// Note the current location and proceed for all alphas and digits.
				const auto start = d_ptr;
				while(isalpha(*d_ptr) || isdigit(*d_ptr)) ++d_ptr;

				// Add a string view.
				result.emplace_back(std::string(start, size_t(d_ptr - start)));
			}

			members_by_type_.emplace(std::make_pair(std::type_index(typeid(Type)), result));
			names_by_type_.emplace(std::make_pair(std::type_index(typeid(Type)), std::string(name)));
		}